

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.c
# Opt level: O0

void sysbvm_analysisQueue_enqueueProgramEntity
               (sysbvm_context_t *context,sysbvm_tuple_t queue,sysbvm_tuple_t programEntity)

{
  _Bool _Var1;
  sysbvm_tuple_t sVar2;
  sysbvm_tuple_t newEntry;
  sysbvm_analysisQueue_t *queueObject;
  sysbvm_tuple_t programEntity_local;
  sysbvm_tuple_t queue_local;
  sysbvm_context_t *context_local;
  
  _Var1 = sysbvm_tuple_isNonNullPointer(queue);
  if (!_Var1) {
    sysbvm_error("Expected a valid analysis queue.");
  }
  sVar2 = sysbvm_analysisQueueEntry_create(context,programEntity);
  if (*(long *)(queue + 0x18) == 0) {
    *(sysbvm_tuple_t *)(queue + 0x10) = sVar2;
  }
  else {
    *(sysbvm_tuple_t *)(*(long *)(queue + 0x18) + 0x18) = sVar2;
  }
  *(sysbvm_tuple_t *)(queue + 0x18) = sVar2;
  return;
}

Assistant:

SYSBVM_API void sysbvm_analysisQueue_enqueueProgramEntity(sysbvm_context_t *context, sysbvm_tuple_t queue, sysbvm_tuple_t programEntity)
{
    if(!sysbvm_tuple_isNonNullPointer(queue))
        sysbvm_error("Expected a valid analysis queue.");

    sysbvm_analysisQueue_t *queueObject = (sysbvm_analysisQueue_t*)queue;
    sysbvm_tuple_t newEntry = sysbvm_analysisQueueEntry_create(context, programEntity);
    if(queueObject->lastEntry)
        ((sysbvm_analysisQueueEntry_t*)queueObject->lastEntry)->nextEntry = newEntry;
    else
        queueObject->firstEntry = newEntry;
    queueObject->lastEntry = newEntry;
}